

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.upb.h
# Opt level: O0

google_protobuf_compiler_CodeGeneratorRequest *
google_protobuf_compiler_CodeGeneratorRequest_parse(char *buf,size_t size,upb_Arena *arena)

{
  upb_DecodeStatus uVar1;
  google_protobuf_compiler_CodeGeneratorRequest *ret;
  upb_Arena *arena_local;
  size_t size_local;
  char *buf_local;
  
  buf_local = (char *)google_protobuf_compiler_CodeGeneratorRequest_new(arena);
  if ((google_protobuf_compiler_CodeGeneratorRequest *)buf_local ==
      (google_protobuf_compiler_CodeGeneratorRequest *)0x0) {
    buf_local = (char *)0x0;
  }
  else {
    uVar1 = upb_Decode(buf,size,(upb_Message *)buf_local,
                       &google__protobuf__compiler__CodeGeneratorRequest_msg_init,
                       (upb_ExtensionRegistry *)0x0,0,arena);
    if (uVar1 != kUpb_DecodeStatus_Ok) {
      buf_local = (char *)0x0;
    }
  }
  return (google_protobuf_compiler_CodeGeneratorRequest *)buf_local;
}

Assistant:

UPB_INLINE google_protobuf_compiler_CodeGeneratorRequest* google_protobuf_compiler_CodeGeneratorRequest_parse(const char* buf, size_t size, upb_Arena* arena) {
  google_protobuf_compiler_CodeGeneratorRequest* ret = google_protobuf_compiler_CodeGeneratorRequest_new(arena);
  if (!ret) return NULL;
  if (upb_Decode(buf, size, UPB_UPCAST(ret), &google__protobuf__compiler__CodeGeneratorRequest_msg_init, NULL, 0, arena) !=
      kUpb_DecodeStatus_Ok) {
    return NULL;
  }
  return ret;
}